

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_subx(DisasContext_conflict2 *s,TCGv_i32 src,TCGv_i32 dest,int opsize)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ah;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  int opsize_local;
  TCGv_i32 dest_local;
  TCGv_i32 src_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_flush_flags(s);
  ah = tcg_const_i32_m68k(tcg_ctx_00,0);
  tcg_gen_add2_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_X,src,ah,QREG_CC_X,ah);
  tcg_gen_sub2_i32_m68k(tcg_ctx_00,QREG_CC_N,QREG_CC_X,dest,ah,QREG_CC_N,QREG_CC_X);
  gen_ext(tcg_ctx_00,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_andi_i32_m68k(tcg_ctx_00,QREG_CC_X,QREG_CC_X,1);
  tcg_gen_xor_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_N,dest);
  tcg_gen_xor_i32(tcg_ctx_00,ah,dest,src);
  tcg_gen_and_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V,ah);
  tcg_temp_free_i32(tcg_ctx_00,ah);
  tcg_gen_or_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
  tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_C,QREG_CC_X);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void gen_subx(DisasContext *s, TCGv src, TCGv dest, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    gen_flush_flags(s); /* compute old Z */

    /*
     * Perform substract with borrow.
     * (X, N) = dest - (src + X);
     */

    tmp = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, src, tmp, QREG_CC_X, tmp);
    tcg_gen_sub2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, dest, tmp, QREG_CC_N, QREG_CC_X);
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_X, QREG_CC_X, 1);

    /* Compute signed-overflow for substract.  */

    tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, dest);
    tcg_gen_xor_i32(tcg_ctx, tmp, dest, src);
    tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, tmp);
    tcg_temp_free(tcg_ctx, tmp);

    /* Copy the rest of the results into place.  */
    tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N); /* !Z is sticky */
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);

    set_cc_op(s, CC_OP_FLAGS);

    /* result is in QREG_CC_N */
}